

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_algs.cc
# Opt level: O2

void CB_ALGS::learn_eval(cb *data,single_learner *param_2,example *ec)

{
  cb_class *pcVar1;
  long lVar2;
  size_t i;
  ulong uVar3;
  label ld;
  label lStack_40;
  
  lStack_40.costs.erase_count = (ec->l).cb_eval.event.costs.erase_count;
  lStack_40.costs._begin = (cb_class *)(ec->l).cs.costs._end;
  lStack_40.costs._end = (cb_class *)(ec->l).cs.costs.end_array;
  lStack_40.costs.end_array = (cb_class *)(ec->l).cs.costs.erase_count;
  pcVar1 = GEN_CS::get_observed_cost(&lStack_40);
  (data->cbcs).known_cost = pcVar1;
  GEN_CS::gen_cs_example<true>(&data->cbcs,ec,&lStack_40,&data->cb_cs_ld);
  lVar2 = 0;
  for (uVar3 = 0; uVar3 < (ulong)((long)lStack_40.costs._end - (long)lStack_40.costs._begin >> 4);
      uVar3 = uVar3 + 1) {
    *(undefined4 *)((long)&(lStack_40.costs._begin)->partial_prediction + lVar2) =
         *(undefined4 *)((long)&((data->cb_cs_ld).costs._begin)->partial_prediction + lVar2);
    lVar2 = lVar2 + 0x10;
  }
  (ec->pred).scalar = (ec->l).simple.label;
  return;
}

Assistant:

void learn_eval(cb& data, single_learner&, example& ec)
{
  CB_EVAL::label ld = ec.l.cb_eval;

  cb_to_cs& c = data.cbcs;
  c.known_cost = get_observed_cost(ld.event);
  gen_cs_example<true>(c, ec, ld.event, data.cb_cs_ld);

  for (size_t i = 0; i < ld.event.costs.size(); i++)
    ld.event.costs[i].partial_prediction = data.cb_cs_ld.costs[i].partial_prediction;

  ec.pred.multiclass = ec.l.cb_eval.action;
}